

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O1

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedHeight(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  GMM_TEXTURE_INFO *pGVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *this_00;
  uint32_t NumSamples;
  
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  this_00 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar2));
  uVar3 = (*this_00->_vptr_GmmTextureCalc[0x19])(this_00,&this->Surf,(ulong)MipLevel);
  pGVar1 = &this->Surf;
  if ((~(ulong)(this->AuxSurf).Flags.Gpu & 0x20000000002) == 0) {
    pGVar1 = &this->AuxSurf;
  }
  NumSamples = 1;
  if (((ulong)(this->Surf).Flags.Gpu & 0x20000040) != 0) {
    NumSamples = (this->Surf).MSAA.NumSamples;
  }
  uVar4 = GmmTextureCalc::ExpandHeight(this_00,uVar3,(pGVar1->Alignment).VAlign,NumSamples);
  if (((this->Surf).Flags.Gpu.field_0x3 & 0x20) == 0) goto LAB_001ac593;
  uVar4 = uVar4 >> ((byte)((ulong)(this->Surf).Flags.Info >> 0x22) & 1);
  uVar3 = (this->Surf).MSAA.NumSamples;
  if (uVar3 != 4) {
    if (uVar3 == 0x10) {
      uVar4 = uVar4 >> 2;
      goto LAB_001ac593;
    }
    if (uVar3 != 8) goto LAB_001ac593;
  }
  uVar4 = uVar4 >> 1;
LAB_001ac593:
  if ((~(ulong)(this->AuxSurf).Flags.Gpu & 0x20000000002) == 0) {
    uVar3 = (*this_00->_vptr_GmmTextureCalc[0x17])
                      (this_00,&this->AuxSurf,(ulong)uVar4,this_00->_vptr_GmmTextureCalc[0x17]);
    return uVar3;
  }
  return uVar4;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedHeight(uint32_t MipLevel)
{
    GMM_TEXTURE_CALC *pTextureCalc;
    uint32_t          AlignedHeight, MipHeight;
    uint32_t          VAlign;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    // See note in GmmResGetPaddedWidth.
    __GMM_ASSERT(Surf.Flags.Gpu.Depth || Surf.Flags.Gpu.SeparateStencil ||
                 Surf.Flags.Gpu.CCS || Surf.Flags.Gpu.HiZ ||
                 AuxSurf.Flags.Gpu.__MsaaTileMcs ||
                 AuxSurf.Flags.Gpu.CCS || AuxSurf.Flags.Gpu.__NonMsaaTileYCcs);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    MipHeight = pTextureCalc->GmmTexGetMipHeight(&Surf, MipLevel);

    VAlign = Surf.Alignment.VAlign;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        VAlign = AuxSurf.Alignment.VAlign;
    }

    AlignedHeight = __GMM_EXPAND_HEIGHT(pTextureCalc,
                                        MipHeight,
                                        VAlign,
                                        &Surf);

    if(Surf.Flags.Gpu.SeparateStencil)
    {
        if(Surf.Flags.Info.TiledW)
        {
            AlignedHeight /= 2;
        }

        // Reverse MSAA Expansion ////////////////////////////////////////////////
        // See note in GmmResGetPaddedWidth.
        switch(Surf.MSAA.NumSamples)
        {
            case 1:
                break;
            case 2:
                break; // No height adjustment for 2x...
            case 4:    // Same as 8x...
            case 8:
                AlignedHeight /= 2;
                break;
            case 16:
                AlignedHeight /= 4;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }

    // CCS Aux surface, AlignedHeight needs to be scaled by 16
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        AlignedHeight = pTextureCalc->ScaleTextureHeight(&AuxSurf, AlignedHeight);
    }

    return AlignedHeight;
}